

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool mips_cpu_tlb_fill_mips
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  uint uVar1;
  MMUAccessType real_address;
  _Bool _Var2;
  int iStack_54;
  _Bool ret_walker;
  int mode;
  int ret;
  int mips_access_type;
  int prot;
  hwaddr physical;
  CPUMIPSState *env;
  MIPSCPU *cpu;
  MMUAccessType MStack_28;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  vaddr address_local;
  CPUState *cs_local;
  
  physical = (hwaddr)(cs[1].tb_jmp_cache + 0x13f);
  access_type_local = (MMUAccessType)address;
  env = (CPUMIPSState *)cs;
  cpu._3_1_ = probe;
  cpu._4_4_ = mmu_idx;
  MStack_28 = access_type;
  mmu_idx_local = size;
  real_address = access_type_local;
  _access_type_local = address;
  address_local = (vaddr)cs;
  iStack_54 = get_physical_address
                        ((CPUMIPSState *)physical,(hwaddr *)&mips_access_type,&ret,real_address,
                         access_type,0x20,mmu_idx);
  if (iStack_54 == 0) {
    tlb_set_page_mips((CPUState *)address_local,(uint)_access_type_local & 0xfffff000,
                      _mips_access_type & 0xfffff000,ret,cpu._4_4_,0x1000);
    cs_local._7_1_ = true;
  }
  else {
    if ((iStack_54 == -2) && (1 < **(uint **)(physical + 0x2bc8))) {
      uVar1 = *(uint *)(physical + 0x2b94);
      *(uint *)(physical + 0x2b94) = *(uint *)(physical + 0x2b94) & 0xfffffffc;
      _Var2 = page_table_walk_refill
                        ((CPUMIPSState *)physical,_access_type_local,MStack_28,cpu._4_4_);
      *(uint *)(physical + 0x2b94) = uVar1 & 3 | *(uint *)(physical + 0x2b94);
      if ((_Var2) &&
         (iStack_54 = get_physical_address
                                ((CPUMIPSState *)physical,(hwaddr *)&mips_access_type,&ret,
                                 (target_ulong_conflict)_access_type_local,MStack_28,0x20,cpu._4_4_)
         , iStack_54 == 0)) {
        tlb_set_page_mips((CPUState *)address_local,(uint)_access_type_local & 0xfffff000,
                          _mips_access_type & 0xfffff000,ret,cpu._4_4_,0x1000);
        return true;
      }
    }
    if ((cpu._3_1_ & 1) == 0) {
      raise_mmu_exception((CPUMIPSState *)physical,(target_ulong_conflict)_access_type_local,
                          MStack_28,iStack_54);
      do_raise_exception_err_mips
                ((CPUMIPSState *)physical,*(uint32_t *)(address_local + 0x81a0),
                 *(int *)(physical + 0x2b90),retaddr);
    }
    cs_local._7_1_ = false;
  }
  return cs_local._7_1_;
}

Assistant:

bool mips_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                       MMUAccessType access_type, int mmu_idx,
                       bool probe, uintptr_t retaddr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    hwaddr physical;
    int prot;
    int mips_access_type;
    int ret = TLBRET_BADADDR;

    /* data access */
    /* XXX: put correct access by using cpu_restore_state() correctly */
    mips_access_type = ACCESS_INT;
    ret = get_physical_address(env, &physical, &prot, address,
                               access_type, mips_access_type, mmu_idx);
    switch (ret) {
    case TLBRET_MATCH:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " physical " TARGET_FMT_plx
                      " prot %d\n", __func__, address, physical, prot);
        break;
    default:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " ret %d\n", __func__, address,
                      ret);
        break;
    }
    if (ret == TLBRET_MATCH) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK,
                     physical & TARGET_PAGE_MASK, prot,
                     mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }
#if !defined(TARGET_MIPS64)
    if ((ret == TLBRET_NOMATCH) && (env->tlb->nb_tlb > 1)) {
        /*
         * Memory reads during hardware page table walking are performed
         * as if they were kernel-mode load instructions.
         */
        int mode = (env->hflags & MIPS_HFLAG_KSU);
        bool ret_walker;
        env->hflags &= ~MIPS_HFLAG_KSU;
        ret_walker = page_table_walk_refill(env, address, access_type, mmu_idx);
        env->hflags |= mode;
        if (ret_walker) {
            ret = get_physical_address(env, &physical, &prot, address,
                                       access_type, mips_access_type, mmu_idx);
            if (ret == TLBRET_MATCH) {
                tlb_set_page(cs, address & TARGET_PAGE_MASK,
                             physical & TARGET_PAGE_MASK, prot,
                             mmu_idx, TARGET_PAGE_SIZE);
                return true;
            }
        }
    }
#endif
    if (probe) {
        return false;
    }

    raise_mmu_exception(env, address, access_type, ret);
    do_raise_exception_err(env, cs->exception_index, env->error_code, retaddr);
}